

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O0

ostream * __thiscall
dynamicgraph::
SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
::displayDependencies
          (SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,ostream *os,int depth,string *space,string *next1,string *next2)

{
  ostream *poVar1;
  string local_a8;
  string local_78;
  string local_58;
  string *local_38;
  string *next2_local;
  string *next1_local;
  string *space_local;
  ostream *poStack_18;
  int depth_local;
  ostream *os_local;
  SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  
  local_38 = next2;
  next2_local = next1;
  next1_local = space;
  space_local._4_4_ = depth;
  poStack_18 = os;
  os_local = (ostream *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)space);
  std::__cxx11::string::string((string *)&local_78,(string *)next1);
  std::__cxx11::string::string((string *)&local_a8,(string *)next2);
  poVar1 = TimeDependency<int>::displayDependencies
                     (&this->super_TimeDependency<int>,os,depth,&local_58,&local_78,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return poVar1;
}

Assistant:

std::ostream &displayDependencies(std::ostream &os, const int depth = -1,
                                    std::string space = "",
                                    std::string next1 = "",
                                    std::string next2 = "") const {
    return TimeDependency<Time>::displayDependencies(os, depth, space, next1,
                                                     next2);
  }